

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall TypeTest_IndexedTypePrinter_Test::TestBody(TypeTest_IndexedTypePrinter_Test *this)

{
  pointer *this_00;
  string *psVar1;
  Printed PVar2;
  Printed PVar3;
  Printed PVar4;
  Printed PVar5;
  HeapType HVar6;
  long *plVar7;
  Type TVar8;
  Type TVar9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *in_R9;
  char *pcVar10;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::HeapType> __l_01;
  initializer_list<wasm::HeapType> __l_02;
  undefined8 uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  stringstream stream;
  undefined1 local_418 [376];
  undefined1 local_2a0 [8];
  StructPrinter print;
  _Function_base local_200;
  Printed local_1e0;
  Printed local_1b8;
  Printed local_190;
  undefined1 auStack_168 [8];
  ArrayPrinter printArrays;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> structs;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> arrays;
  BuildResult result;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  TypeBuilder builder;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  
  this_00 = &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)this_00,4);
  ::wasm::TypeBuilder::createRecGroup((ulong)this_00,0);
  HVar6 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xfffffffffffffbd8);
  plVar7 = (long *)::wasm::TypeBuilder::getTempRefType
                             ((HeapType)this_00,(Nullability)HVar6.id,Exact);
  HVar6 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xfffffffffffffbd8);
  TVar8.id = ::wasm::TypeBuilder::getTempRefType
                       ((HeapType)
                        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(Nullability)HVar6.id,
                        Exact);
  HVar6 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xfffffffffffffbd8);
  _Var13._M_p = (pointer)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
  TVar9.id = ::wasm::TypeBuilder::getTempRefType((HeapType)_Var13._M_p,(Nullability)HVar6.id,Exact);
  HVar6 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xfffffffffffffbd8);
  local_2a0 = (undefined1  [8])
              ::wasm::TypeBuilder::getTempRefType((HeapType)_Var13._M_p,(Nullability)HVar6.id,Exact)
  ;
  print.defaultGenerator.funcCount = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_2a0;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168,__l,
             (allocator_type *)&gtest_ar.message_);
  local_418._0_8_ = printArrays.defaultGenerator.contCount;
  auStack_168 = (undefined1  [8])0x0;
  printArrays.defaultGenerator.funcCount = 0;
  printArrays.defaultGenerator.contCount = 0;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)_Var13._M_p;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Struct *)&stack0xfffffffffffffbd8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xfffffffffffffbd8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168);
  print.defaultGenerator.funcCount = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_2a0;
  local_2a0 = (undefined1  [8])plVar7;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168,__l_00,
             (allocator_type *)&gtest_ar.message_);
  local_418._0_8_ = printArrays.defaultGenerator.contCount;
  printArrays.defaultGenerator.contCount = 0;
  auStack_168 = (undefined1  [8])0x0;
  printArrays.defaultGenerator.funcCount = 0;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 1
  ;
  arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)_Var13._M_p;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Struct *)&stack0xfffffffffffffbd8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xfffffffffffffbd8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168);
  uVar11._0_4_ = not_packed;
  uVar11._4_4_ = Immutable;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)&stack0xfffffffffffffbd8,(Array *)&stack0xfffffffffffffbb8);
  uVar12._0_4_ = not_packed;
  uVar12._4_4_ = Immutable;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)&stack0xfffffffffffffbd8,(Array *)&stack0xfffffffffffffbc8);
  ::wasm::TypeBuilder::build();
  printArrays.defaultGenerator.funcCount = 0;
  auStack_168[0] =
       result.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\0';
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printArrays);
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18),__x);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&stack0xfffffffffffffbd8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &printArrays.names._M_h._M_single_bucket,__l_01,(allocator_type *)auStack_168);
    _Var13._M_p = *(pointer *)
                   (result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_ + 0x10);
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&stack0xfffffffffffffbd8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_02,(allocator_type *)auStack_168);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffbd8,"array",(allocator<char> *)local_2a0);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_168,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&stack0xfffffffffffffbd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffbd8,"struct",(allocator<char> *)&gtest_ar.message_);
    ::wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
    ::IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
                *)local_2a0,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &printArrays.names._M_h._M_single_bucket,
               (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_168,
               (string *)&stack0xfffffffffffffbd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffbd8);
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()((Printed *)&print.names._M_h._M_single_bucket,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_2a0,
                 (HeapType)
                 *(uintptr_t *)
                  result.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._24_8_);
    PVar2.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)uVar11;
    PVar2.typeID = TVar8.id;
    PVar2.generateName.super__Function_base._M_functor._8_8_ = TVar9.id;
    PVar2.generateName.super__Function_base._M_manager = (_Manager_type)uVar12;
    PVar2.generateName._M_invoker = (_Invoker_type)_Var13._M_p;
    ::wasm::operator<<((ostream *)local_418,PVar2);
    std::_Function_base::~_Function_base(&local_200);
    psVar1 = (string *)(local_418 + 8);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[52]>
              ((internal *)&builder,"stream.str()",
               "\"(type $struct0 (struct (field (ref null $array1))))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,
               (char (*) [52])"(type $struct0 (struct (field (ref null $array1))))");
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x70,pcVar10);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    pcVar10 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar.message_,"",(allocator<char> *)&builder);
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1e0,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_2a0,
                 (HeapType)
                 *(uintptr_t *)
                  (result.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_ + 8));
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)uVar11;
    PVar3.typeID = TVar8.id;
    PVar3.generateName.super__Function_base._M_functor._8_8_ = TVar9.id;
    PVar3.generateName.super__Function_base._M_manager = (_Manager_type)uVar12;
    PVar3.generateName._M_invoker = (_Invoker_type)_Var13._M_p;
    ::wasm::operator<<((ostream *)local_418,PVar3);
    std::_Function_base::~_Function_base(&local_1e0.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[53]>
              ((internal *)&builder,"stream.str()",
               "\"(type $struct1 (struct (field (ref null $struct0))))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,
               (char (*) [53])"(type $struct1 (struct (field (ref null $struct0))))");
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ != 0) {
        pcVar10 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x75,pcVar10);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    pcVar10 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar.message_,"",(allocator<char> *)&builder);
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1b8,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_2a0,
                 (HeapType)
                 *(uintptr_t *)
                  (result.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_ + 0x10));
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)uVar11;
    PVar4.typeID = TVar8.id;
    PVar4.generateName.super__Function_base._M_functor._8_8_ = TVar9.id;
    PVar4.generateName.super__Function_base._M_manager = (_Manager_type)uVar12;
    PVar4.generateName._M_invoker = (_Invoker_type)_Var13._M_p;
    ::wasm::operator<<((ostream *)local_418,PVar4);
    std::_Function_base::~_Function_base(&local_1b8.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[43]>
              ((internal *)&builder,"stream.str()","\"(type $array0 (array (ref null $struct1)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,(char (*) [43])"(type $array0 (array (ref null $struct1)))");
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ != 0) {
        pcVar10 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x79,pcVar10);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    pcVar10 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar.message_,"",(allocator<char> *)&builder);
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_190,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_2a0,
                 (HeapType)
                 *(uintptr_t *)
                  (result.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_ + 0x18));
    PVar5.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)uVar11;
    PVar5.typeID = TVar8.id;
    PVar5.generateName.super__Function_base._M_functor._8_8_ = TVar9.id;
    PVar5.generateName.super__Function_base._M_manager = (_Manager_type)uVar12;
    PVar5.generateName._M_invoker = (_Invoker_type)_Var13._M_p;
    ::wasm::operator<<((ostream *)local_418,PVar5);
    std::_Function_base::~_Function_base(&local_190.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[42]>
              ((internal *)&builder,"stream.str()","\"(type $array1 (array (ref null $array0)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,(char (*) [42])"(type $array1 (array (ref null $array0)))");
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ != 0) {
        pcVar10 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x7d,pcVar10);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffbd8);
    ::wasm::
    IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    ~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_2a0);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_168);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &printArrays.names._M_h._M_single_bucket);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
  }
  else {
    testing::Message::Message((Message *)local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xfffffffffffffbd8,(internal *)auStack_168,
               (AssertionResult *)0x24efbd,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x61,_Var13._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
    if (local_2a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2a0 + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printArrays);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::TypeBuilder::~TypeBuilder
            ((TypeBuilder *)
             &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(TypeTest, IndexedTypePrinter) {
  TypeBuilder builder(4);
  builder.createRecGroup(0, 4);

  Type refStructA = builder.getTempRefType(builder[0], Nullable);
  Type refStructB = builder.getTempRefType(builder[1], Nullable);
  Type refArrayA = builder.getTempRefType(builder[2], Nullable);
  Type refArrayB = builder.getTempRefType(builder[3], Nullable);
  builder[0] = Struct({Field(refArrayB, Immutable)});
  builder[1] = Struct({Field(refStructA, Immutable)});
  builder[2] = Array(Field(refStructB, Immutable));
  builder[3] = Array(Field(refArrayA, Immutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  std::vector<HeapType> structs{built[0], built[1]};
  std::vector<HeapType> arrays{built[2], built[3]};

  // Check that IndexedTypePrinters configured with fallbacks work correctly.
  using ArrayPrinter = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  ArrayPrinter printArrays(arrays, "array");
  using StructPrinter = IndexedTypeNameGenerator<ArrayPrinter>;
  StructPrinter print(structs, printArrays, "struct");

  std::stringstream stream;
  stream << print(built[0]);
  EXPECT_EQ(stream.str(),
            "(type $struct0 (struct (field (ref null $array1))))");

  stream.str("");
  stream << print(built[1]);
  EXPECT_EQ(stream.str(),
            "(type $struct1 (struct (field (ref null $struct0))))");

  stream.str("");
  stream << print(built[2]);
  EXPECT_EQ(stream.str(), "(type $array0 (array (ref null $struct1)))");

  stream.str("");
  stream << print(built[3]);
  EXPECT_EQ(stream.str(), "(type $array1 (array (ref null $array0)))");
}